

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  ulong uVar2;
  RTCIntersectArguments *pRVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  char cVar23;
  bool bVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  undefined4 uVar27;
  uint uVar28;
  RTCIntersectArguments *pRVar29;
  uint uVar30;
  ulong uVar31;
  ulong *puVar32;
  long lVar33;
  NodeRef root;
  undefined1 (*pauVar34) [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 in_ZMM5 [64];
  float fVar67;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  vfloat4 a0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar101 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c20;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  RTCIntersectArguments local_59a0;
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar42 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar48 = *(undefined1 (*) [32])(ray + 0x100);
    auVar38 = vpcmpeqd_avx2(auVar42,(undefined1  [32])valid_i->field_0);
    auVar42 = vcmpps_avx(auVar48,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar42 = vandps_avx(auVar42,auVar38);
    uVar30 = vmovmskps_avx(auVar42);
    if (uVar30 != 0) {
      auVar35 = vpackssdw_avx(auVar42._0_16_,auVar42._16_16_);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5ba0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar101._0_4_ = local_5b80._0_4_ * local_5b80._0_4_;
      auVar101._4_4_ = local_5b80._4_4_ * local_5b80._4_4_;
      auVar101._8_4_ = local_5b80._8_4_ * local_5b80._8_4_;
      auVar101._12_4_ = local_5b80._12_4_ * local_5b80._12_4_;
      auVar101._16_4_ = local_5b80._16_4_ * local_5b80._16_4_;
      auVar101._20_4_ = local_5b80._20_4_ * local_5b80._20_4_;
      auVar101._28_36_ = in_ZMM5._28_36_;
      auVar101._24_4_ = local_5b80._24_4_ * local_5b80._24_4_;
      auVar68 = vfmadd231ps_fma(auVar101._0_32_,local_5ba0,local_5ba0);
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),local_5bc0,local_5bc0);
      auVar42 = vrsqrtps_avx(ZEXT1632(auVar68));
      pRVar29 = &local_59a0;
      uVar31 = (ulong)(uVar30 & 0xff);
      fVar67 = auVar42._0_4_;
      fVar73 = auVar42._4_4_;
      fVar74 = auVar42._8_4_;
      fVar75 = auVar42._12_4_;
      fVar76 = auVar42._16_4_;
      fVar77 = auVar42._20_4_;
      fVar78 = auVar42._24_4_;
      auVar38._4_4_ = fVar73 * fVar73 * fVar73 * auVar68._4_4_ * -0.5;
      auVar38._0_4_ = fVar67 * fVar67 * fVar67 * auVar68._0_4_ * -0.5;
      auVar38._8_4_ = fVar74 * fVar74 * fVar74 * auVar68._8_4_ * -0.5;
      auVar38._12_4_ = fVar75 * fVar75 * fVar75 * auVar68._12_4_ * -0.5;
      auVar38._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar38._20_4_ = fVar77 * fVar77 * fVar77 * -0.0;
      auVar38._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
      auVar38._28_4_ = 0;
      auVar79._8_4_ = 0x3fc00000;
      auVar79._0_8_ = 0x3fc000003fc00000;
      auVar79._12_4_ = 0x3fc00000;
      auVar79._16_4_ = 0x3fc00000;
      auVar79._20_4_ = 0x3fc00000;
      auVar79._24_4_ = 0x3fc00000;
      auVar79._28_4_ = 0x3fc00000;
      auVar68 = vfmadd213ps_fma(auVar79,auVar42,auVar38);
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar68);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar68._12_4_ = 0;
      auVar68._0_12_ = ZEXT812(0);
      auVar68 = auVar68 << 0x20;
      do {
        lVar33 = 0;
        for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar33 = lVar33 + 1;
        }
        uVar26 = (ulong)(uint)((int)lVar33 * 4);
        auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar26 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar26 + 0xa0)),0x1c);
        auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + uVar26 + 0xc0)),0x28);
        fVar67 = *(float *)((long)&local_59c0 + uVar26);
        auVar90._0_4_ = auVar86._0_4_ * fVar67;
        auVar90._4_4_ = auVar86._4_4_ * fVar67;
        auVar90._8_4_ = auVar86._8_4_ * fVar67;
        auVar90._12_4_ = auVar86._12_4_ * fVar67;
        auVar94 = vshufpd_avx(auVar90,auVar90,1);
        auVar86 = vmovshdup_avx(auVar90);
        auVar92 = vunpckhps_avx(auVar90,auVar68);
        auVar91._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
        auVar91._8_8_ = auVar94._8_8_ ^ auVar62._8_8_;
        auVar91 = vinsertps_avx(auVar91,auVar90,0x2a);
        auVar92 = vshufps_avx(auVar92,ZEXT416(auVar86._0_4_ ^ 0x80000000),0x41);
        auVar86 = vdpps_avx(auVar91,auVar91,0x7f);
        auVar94 = vdpps_avx(auVar92,auVar92,0x7f);
        auVar86 = vcmpps_avx(auVar86,auVar94,1);
        auVar96._0_4_ = auVar86._0_4_;
        auVar96._4_4_ = auVar96._0_4_;
        auVar96._8_4_ = auVar96._0_4_;
        auVar96._12_4_ = auVar96._0_4_;
        auVar86 = vblendvps_avx(auVar91,auVar92,auVar96);
        auVar94 = vdpps_avx(auVar86,auVar86,0x7f);
        auVar91 = vrsqrtss_avx(auVar94,auVar94);
        fVar73 = auVar91._0_4_;
        fVar73 = fVar73 * 1.5 - auVar94._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        auVar92._0_4_ = auVar86._0_4_ * fVar73;
        auVar92._4_4_ = auVar86._4_4_ * fVar73;
        auVar92._8_4_ = auVar86._8_4_ * fVar73;
        auVar92._12_4_ = auVar86._12_4_ * fVar73;
        auVar86 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar94 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar97._0_4_ = auVar92._0_4_ * auVar94._0_4_;
        auVar97._4_4_ = auVar92._4_4_ * auVar94._4_4_;
        auVar97._8_4_ = auVar92._8_4_ * auVar94._8_4_;
        auVar97._12_4_ = auVar92._12_4_ * auVar94._12_4_;
        auVar86 = vfmsub231ps_fma(auVar97,auVar90,auVar86);
        auVar91 = vshufps_avx(auVar86,auVar86,0xc9);
        auVar86 = vdpps_avx(auVar91,auVar91,0x7f);
        lVar33 = lVar33 * 0x30;
        auVar94 = vrsqrtss_avx(auVar86,auVar86);
        fVar73 = auVar94._0_4_;
        auVar115 = ZEXT464((uint)(fVar73 * fVar73));
        auVar101 = ZEXT464((uint)(fVar73 * 1.5));
        fVar73 = fVar73 * 1.5 - auVar86._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
        uVar31 = uVar31 - 1 & uVar31;
        auVar94._0_4_ = fVar73 * auVar91._0_4_;
        auVar94._4_4_ = fVar73 * auVar91._4_4_;
        auVar94._8_4_ = fVar73 * auVar91._8_4_;
        auVar94._12_4_ = fVar73 * auVar91._12_4_;
        auVar86._0_4_ = fVar67 * auVar90._0_4_;
        auVar86._4_4_ = fVar67 * auVar90._4_4_;
        auVar86._8_4_ = fVar67 * auVar90._8_4_;
        auVar86._12_4_ = fVar67 * auVar90._12_4_;
        auVar91 = vunpcklps_avx(auVar92,auVar86);
        auVar86 = vunpckhps_avx(auVar92,auVar86);
        auVar92 = vunpcklps_avx(auVar94,auVar68);
        auVar94 = vunpckhps_avx(auVar94,auVar68);
        auVar94 = vunpcklps_avx(auVar86,auVar94);
        auVar90 = vunpcklps_avx(auVar91,auVar92);
        auVar86 = vunpckhps_avx(auVar91,auVar92);
        ((RayQueryContext *)((long)pRVar29 + lVar33))->scene = (Scene *)auVar90._0_8_;
        ((RayQueryContext *)((long)pRVar29 + lVar33))->user = (RTCRayQueryContext *)auVar90._8_8_;
        *(undefined1 (*) [16])(auStack_5980 + lVar33 + -0x10) = auVar86;
        *(undefined1 (*) [16])(auStack_5980 + lVar33) = auVar94;
      } while (uVar31 != 0);
      local_5c20._0_8_ = *(undefined8 *)ray;
      local_5c20._8_8_ = *(undefined8 *)(ray + 8);
      local_5c20._16_8_ = *(undefined8 *)(ray + 0x10);
      local_5c20._24_8_ = *(undefined8 *)(ray + 0x18);
      local_5c20._32_8_ = *(undefined8 *)(ray + 0x20);
      local_5c20._40_8_ = *(undefined8 *)(ray + 0x28);
      local_5c20._48_8_ = *(undefined8 *)(ray + 0x30);
      local_5c20._56_8_ = *(undefined8 *)(ray + 0x38);
      local_5c20._64_8_ = *(undefined8 *)(ray + 0x40);
      local_5c20._72_8_ = *(undefined8 *)(ray + 0x48);
      local_5c20._80_8_ = *(undefined8 *)(ray + 0x50);
      local_5c20._88_8_ = *(undefined8 *)(ray + 0x58);
      local_5a20._8_4_ = 0x7fffffff;
      local_5a20._0_8_ = 0x7fffffff7fffffff;
      local_5a20._12_4_ = 0x7fffffff;
      local_5a20._16_4_ = 0x7fffffff;
      local_5a20._20_4_ = 0x7fffffff;
      local_5a20._24_4_ = 0x7fffffff;
      local_5a20._28_4_ = 0x7fffffff;
      auVar87._8_4_ = 0x219392ef;
      auVar87._0_8_ = 0x219392ef219392ef;
      auVar87._12_4_ = 0x219392ef;
      auVar87._16_4_ = 0x219392ef;
      auVar87._20_4_ = 0x219392ef;
      auVar87._24_4_ = 0x219392ef;
      auVar87._28_4_ = 0x219392ef;
      auVar80._8_4_ = 0x3f800000;
      auVar80._0_8_ = 0x3f8000003f800000;
      auVar80._12_4_ = 0x3f800000;
      auVar80._16_4_ = 0x3f800000;
      auVar80._20_4_ = 0x3f800000;
      auVar80._24_4_ = 0x3f800000;
      auVar80._28_4_ = 0x3f800000;
      auVar42 = vandps_avx(local_5a20,local_5bc0);
      auVar49 = vdivps_avx(auVar80,local_5bc0);
      auVar38 = vcmpps_avx(auVar42,auVar87,1);
      auVar53 = vdivps_avx(auVar80,local_5ba0);
      auVar42 = vandps_avx(local_5a20,local_5ba0);
      auVar54 = vdivps_avx(auVar80,_local_5b80);
      auVar79 = vcmpps_avx(auVar42,auVar87,1);
      auVar42 = vandps_avx(local_5a20,_local_5b80);
      auVar84._8_4_ = 0x5d5e0b6b;
      auVar84._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar84._12_4_ = 0x5d5e0b6b;
      auVar84._16_4_ = 0x5d5e0b6b;
      auVar84._20_4_ = 0x5d5e0b6b;
      auVar84._24_4_ = 0x5d5e0b6b;
      auVar84._28_4_ = 0x5d5e0b6b;
      local_5b60 = vblendvps_avx(auVar49,auVar84,auVar38);
      local_5b40 = vblendvps_avx(auVar53,auVar84,auVar79);
      auVar42 = vcmpps_avx(auVar42,auVar87,1);
      _local_5b20 = vblendvps_avx(auVar54,auVar84,auVar42);
      auVar42 = vcmpps_avx(local_5b60,ZEXT832(0) << 0x20,1);
      auVar63._8_4_ = 0x20;
      auVar63._0_8_ = 0x2000000020;
      auVar63._12_4_ = 0x20;
      auVar63._16_4_ = 0x20;
      auVar63._20_4_ = 0x20;
      auVar63._24_4_ = 0x20;
      auVar63._28_4_ = 0x20;
      local_5b00 = vandps_avx(auVar42,auVar63);
      auVar53._8_4_ = 0x40;
      auVar53._0_8_ = 0x4000000040;
      auVar53._12_4_ = 0x40;
      auVar53._16_4_ = 0x40;
      auVar53._20_4_ = 0x40;
      auVar53._24_4_ = 0x40;
      auVar53._28_4_ = 0x40;
      auVar64._8_4_ = 0x60;
      auVar64._0_8_ = 0x6000000060;
      auVar64._12_4_ = 0x60;
      auVar64._16_4_ = 0x60;
      auVar64._20_4_ = 0x60;
      auVar64._24_4_ = 0x60;
      auVar64._28_4_ = 0x60;
      auVar42 = vcmpps_avx(local_5b40,ZEXT832(0) << 0x20,5);
      local_5ae0 = vblendvps_avx(auVar64,auVar53,auVar42);
      auVar49._8_4_ = 0x80;
      auVar49._0_8_ = 0x8000000080;
      auVar49._12_4_ = 0x80;
      auVar49._16_4_ = 0x80;
      auVar49._20_4_ = 0x80;
      auVar49._24_4_ = 0x80;
      auVar49._28_4_ = 0x80;
      auVar54._8_4_ = 0xa0;
      auVar54._0_8_ = 0xa0000000a0;
      auVar54._12_4_ = 0xa0;
      auVar54._16_4_ = 0xa0;
      auVar54._20_4_ = 0xa0;
      auVar54._24_4_ = 0xa0;
      auVar54._28_4_ = 0xa0;
      auVar38 = ZEXT832(0) << 0x20;
      auVar42 = vcmpps_avx(_local_5b20,auVar38,5);
      local_5ac0 = vblendvps_avx(auVar54,auVar49,auVar42);
      auVar42 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar38);
      auVar48 = vmaxps_avx(auVar48,auVar38);
      local_5a60 = vpmovsxwd_avx2(auVar35);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar89 = ZEXT3264(local_4680);
      local_5aa0 = vblendvps_avx(local_4680,auVar42,local_5a60);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar42._16_4_ = 0xff800000;
      auVar42._20_4_ = 0xff800000;
      auVar42._24_4_ = 0xff800000;
      auVar42._28_4_ = 0xff800000;
      local_5a80 = vblendvps_avx(auVar42,auVar48,local_5a60);
      auVar68 = vpcmpeqd_avx(local_5a80._0_16_,local_5a80._0_16_);
      local_5c60 = vpmovsxwd_avx2(auVar35 ^ auVar68);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 7;
      }
      else {
        pRVar29 = context->args;
        uVar30 = (uint)(((ulong)*(Scene **)&pRVar29->flags & 0x10000) == 0) * 5 + 2;
      }
      puVar32 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar34 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar1;
      local_4660 = local_5aa0;
      local_5a40 = mm_lookupmask_ps._16_8_;
      uStack_5a38 = mm_lookupmask_ps._24_8_;
      uStack_5a30 = mm_lookupmask_ps._16_8_;
      uStack_5a28 = mm_lookupmask_ps._24_8_;
LAB_00610e73:
      do {
        do {
          root.ptr = puVar32[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0061165c;
          puVar32 = puVar32 + -1;
          pauVar34 = pauVar34 + -1;
          auVar48 = *pauVar34;
          auVar52 = ZEXT3264(auVar48);
          auVar42 = vcmpps_avx(auVar48,local_5a80,1);
        } while ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar42 >> 0x7f,0) == '\0') &&
                   (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar42 >> 0xbf,0) == '\0') &&
                 (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar42[0x1f]);
        uVar27 = vmovmskps_avx(auVar42);
        pRVar29 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar29 >> 0x20),uVar27);
        if (uVar30 < (uint)POPCOUNT(uVar27)) {
LAB_00610eb0:
          do {
            auVar48 = local_5c60;
            iVar25 = 4;
            lVar33 = -0x20;
            uVar31 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0061165c;
              auVar42 = vcmpps_avx(local_5a80,auVar52._0_32_,6);
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                pRVar29 = (RTCIntersectArguments *)This->leafIntersector;
                local_5c40._8_8_ = uStack_5a38;
                local_5c40._0_8_ = local_5a40;
                local_5c40._16_8_ = uStack_5a30;
                local_5c40._24_8_ = uStack_5a28;
                uVar28 = vmovmskps_avx(local_5c60);
                if ((uVar28 ^ 0xff) != 0) {
                  uVar31 = (ulong)((uVar28 ^ 0xff) & 0xff);
                  pRVar3 = pRVar29 + (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 2 + 1;
                  do {
                    lVar33 = 0;
                    for (uVar26 = uVar31; (uVar26 & 1) == 0;
                        uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                      lVar33 = lVar33 + 1;
                    }
                    auVar101 = ZEXT1664(auVar101._0_16_);
                    auVar115 = ZEXT1664(auVar115._0_16_);
                    pRVar29 = (RTCIntersectArguments *)context;
                    cVar23 = (*(code *)pRVar3->context)
                                       (&local_59c0,ray,lVar33,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar23 != '\0') {
                      *(undefined4 *)(local_5c40 + lVar33 * 4) = 0xffffffff;
                    }
                    uVar31 = uVar31 - 1 & uVar31;
                  } while (uVar31 != 0);
                  auVar89 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                }
                local_5c60 = vorps_avx(local_5c40,auVar48);
                auVar48 = _DAT_01fe9960 & ~local_5c60;
                if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar48 >> 0x7f,0) == '\0') &&
                      (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar48 >> 0xbf,0) == '\0') &&
                    (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar48[0x1f]) goto LAB_0061165c;
                auVar47._8_4_ = 0xff800000;
                auVar47._0_8_ = 0xff800000ff800000;
                auVar47._12_4_ = 0xff800000;
                auVar47._16_4_ = 0xff800000;
                auVar47._20_4_ = 0xff800000;
                auVar47._24_4_ = 0xff800000;
                auVar47._28_4_ = 0xff800000;
                local_5a80 = vblendvps_avx(local_5a80,auVar47,local_5c60);
              }
              goto LAB_00610e73;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            uVar28 = (uint)root.ptr & 7;
            pRVar29 = (RTCIntersectArguments *)0x0;
            auVar48 = vcmpps_avx(local_5a80,auVar52._0_32_,6);
            auVar42 = auVar89._0_32_;
            do {
              uVar2 = *(ulong *)(uVar26 + 0x40 + lVar33 * 2);
              if (uVar2 == 8) {
                auVar52 = ZEXT3264(auVar42);
                break;
              }
              auVar52._28_36_ = auVar101._28_36_;
              if ((uVar28 == 6) || (uVar28 == 1)) {
                uVar27 = *(undefined4 *)(uVar26 + 0x120 + lVar33);
                auVar43._4_4_ = uVar27;
                auVar43._0_4_ = uVar27;
                auVar43._8_4_ = uVar27;
                auVar43._12_4_ = uVar27;
                auVar43._16_4_ = uVar27;
                auVar43._20_4_ = uVar27;
                auVar43._24_4_ = uVar27;
                auVar43._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x60 + lVar33);
                auVar50._4_4_ = uVar27;
                auVar50._0_4_ = uVar27;
                auVar50._8_4_ = uVar27;
                auVar50._12_4_ = uVar27;
                auVar50._16_4_ = uVar27;
                auVar50._20_4_ = uVar27;
                auVar50._24_4_ = uVar27;
                auVar50._28_4_ = uVar27;
                auVar38 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar27 = *(undefined4 *)(uVar26 + 0x160 + lVar33);
                auVar55._4_4_ = uVar27;
                auVar55._0_4_ = uVar27;
                auVar55._8_4_ = uVar27;
                auVar55._12_4_ = uVar27;
                auVar55._16_4_ = uVar27;
                auVar55._20_4_ = uVar27;
                auVar55._24_4_ = uVar27;
                auVar55._28_4_ = uVar27;
                auVar35 = vfmadd231ps_fma(auVar50,auVar38,auVar43);
                uVar27 = *(undefined4 *)(uVar26 + 0xa0 + lVar33);
                auVar44._4_4_ = uVar27;
                auVar44._0_4_ = uVar27;
                auVar44._8_4_ = uVar27;
                auVar44._12_4_ = uVar27;
                auVar44._16_4_ = uVar27;
                auVar44._20_4_ = uVar27;
                auVar44._24_4_ = uVar27;
                auVar44._28_4_ = uVar27;
                auVar68 = vfmadd231ps_fma(auVar44,auVar38,auVar55);
                uVar27 = *(undefined4 *)(uVar26 + 0x1a0 + lVar33);
                auVar56._4_4_ = uVar27;
                auVar56._0_4_ = uVar27;
                auVar56._8_4_ = uVar27;
                auVar56._12_4_ = uVar27;
                auVar56._16_4_ = uVar27;
                auVar56._20_4_ = uVar27;
                auVar56._24_4_ = uVar27;
                auVar56._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0xe0 + lVar33);
                auVar65._4_4_ = uVar27;
                auVar65._0_4_ = uVar27;
                auVar65._8_4_ = uVar27;
                auVar65._12_4_ = uVar27;
                auVar65._16_4_ = uVar27;
                auVar65._20_4_ = uVar27;
                auVar65._24_4_ = uVar27;
                auVar65._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x140 + lVar33);
                auVar69._4_4_ = uVar27;
                auVar69._0_4_ = uVar27;
                auVar69._8_4_ = uVar27;
                auVar69._12_4_ = uVar27;
                auVar69._16_4_ = uVar27;
                auVar69._20_4_ = uVar27;
                auVar69._24_4_ = uVar27;
                auVar69._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x80 + lVar33);
                auVar81._4_4_ = uVar27;
                auVar81._0_4_ = uVar27;
                auVar81._8_4_ = uVar27;
                auVar81._12_4_ = uVar27;
                auVar81._16_4_ = uVar27;
                auVar81._20_4_ = uVar27;
                auVar81._24_4_ = uVar27;
                auVar81._28_4_ = uVar27;
                auVar62 = vfmadd231ps_fma(auVar65,auVar38,auVar56);
                auVar86 = vfmadd231ps_fma(auVar81,auVar38,auVar69);
                uVar27 = *(undefined4 *)(uVar26 + 0x180 + lVar33);
                auVar57._4_4_ = uVar27;
                auVar57._0_4_ = uVar27;
                auVar57._8_4_ = uVar27;
                auVar57._12_4_ = uVar27;
                auVar57._16_4_ = uVar27;
                auVar57._20_4_ = uVar27;
                auVar57._24_4_ = uVar27;
                auVar57._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0xc0 + lVar33);
                auVar70._4_4_ = uVar27;
                auVar70._0_4_ = uVar27;
                auVar70._8_4_ = uVar27;
                auVar70._12_4_ = uVar27;
                auVar70._16_4_ = uVar27;
                auVar70._20_4_ = uVar27;
                auVar70._24_4_ = uVar27;
                auVar70._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x1c0 + lVar33);
                auVar85._4_4_ = uVar27;
                auVar85._0_4_ = uVar27;
                auVar85._8_4_ = uVar27;
                auVar85._12_4_ = uVar27;
                auVar85._16_4_ = uVar27;
                auVar85._20_4_ = uVar27;
                auVar85._24_4_ = uVar27;
                auVar85._28_4_ = uVar27;
                auVar94 = vfmadd231ps_fma(auVar70,auVar38,auVar57);
                uVar27 = *(undefined4 *)(uVar26 + 0x100 + lVar33);
                auVar58._4_4_ = uVar27;
                auVar58._0_4_ = uVar27;
                auVar58._8_4_ = uVar27;
                auVar58._12_4_ = uVar27;
                auVar58._16_4_ = uVar27;
                auVar58._20_4_ = uVar27;
                auVar58._24_4_ = uVar27;
                auVar58._28_4_ = uVar27;
                auVar91 = vfmadd231ps_fma(auVar58,auVar38,auVar85);
                auVar17._8_8_ = local_5c20._8_8_;
                auVar17._0_8_ = local_5c20._0_8_;
                auVar17._16_8_ = local_5c20._16_8_;
                auVar17._24_8_ = local_5c20._24_8_;
                auVar19._8_8_ = local_5c20._40_8_;
                auVar19._0_8_ = local_5c20._32_8_;
                auVar19._16_8_ = local_5c20._48_8_;
                auVar19._24_8_ = local_5c20._56_8_;
                auVar21._8_8_ = local_5c20._72_8_;
                auVar21._0_8_ = local_5c20._64_8_;
                auVar21._16_8_ = local_5c20._80_8_;
                auVar21._24_8_ = local_5c20._88_8_;
                auVar79 = vsubps_avx(ZEXT1632(auVar35),auVar17);
                auVar4._4_4_ = local_5b60._4_4_ * auVar79._4_4_;
                auVar4._0_4_ = local_5b60._0_4_ * auVar79._0_4_;
                auVar4._8_4_ = local_5b60._8_4_ * auVar79._8_4_;
                auVar4._12_4_ = local_5b60._12_4_ * auVar79._12_4_;
                auVar4._16_4_ = local_5b60._16_4_ * auVar79._16_4_;
                auVar4._20_4_ = local_5b60._20_4_ * auVar79._20_4_;
                auVar4._24_4_ = local_5b60._24_4_ * auVar79._24_4_;
                auVar4._28_4_ = auVar79._28_4_;
                auVar79 = vsubps_avx(ZEXT1632(auVar68),auVar19);
                auVar52._0_4_ = local_5b40._0_4_ * auVar79._0_4_;
                auVar52._4_4_ = local_5b40._4_4_ * auVar79._4_4_;
                auVar52._8_4_ = local_5b40._8_4_ * auVar79._8_4_;
                auVar52._12_4_ = local_5b40._12_4_ * auVar79._12_4_;
                auVar52._16_4_ = local_5b40._16_4_ * auVar79._16_4_;
                auVar52._20_4_ = local_5b40._20_4_ * auVar79._20_4_;
                auVar52._24_4_ = local_5b40._24_4_ * auVar79._24_4_;
                auVar53 = auVar52._0_32_;
                auVar101 = ZEXT3264(auVar53);
                auVar79 = vsubps_avx(ZEXT1632(auVar62),auVar21);
                auVar115._0_4_ = auVar79._0_4_ * (float)local_5b20._0_4_;
                auVar115._4_4_ = auVar79._4_4_ * (float)local_5b20._4_4_;
                auVar115._8_4_ = auVar79._8_4_ * fStack_5b18;
                auVar115._12_4_ = auVar79._12_4_ * fStack_5b14;
                auVar115._16_4_ = auVar79._16_4_ * fStack_5b10;
                auVar115._20_4_ = auVar79._20_4_ * fStack_5b0c;
                auVar115._24_4_ = auVar79._24_4_ * fStack_5b08;
                auVar54 = auVar115._0_32_;
                auVar115 = ZEXT3264(auVar54);
                auVar79 = vsubps_avx(ZEXT1632(auVar86),auVar17);
                auVar82._0_4_ = local_5b60._0_4_ * auVar79._0_4_;
                auVar82._4_4_ = local_5b60._4_4_ * auVar79._4_4_;
                auVar82._8_4_ = local_5b60._8_4_ * auVar79._8_4_;
                auVar82._12_4_ = local_5b60._12_4_ * auVar79._12_4_;
                auVar82._16_4_ = local_5b60._16_4_ * auVar79._16_4_;
                auVar82._20_4_ = local_5b60._20_4_ * auVar79._20_4_;
                auVar82._24_4_ = local_5b60._24_4_ * auVar79._24_4_;
                auVar82._28_4_ = 0;
                auVar79 = vsubps_avx(ZEXT1632(auVar94),auVar19);
                auVar71._0_4_ = local_5b40._0_4_ * auVar79._0_4_;
                auVar71._4_4_ = local_5b40._4_4_ * auVar79._4_4_;
                auVar71._8_4_ = local_5b40._8_4_ * auVar79._8_4_;
                auVar71._12_4_ = local_5b40._12_4_ * auVar79._12_4_;
                auVar71._16_4_ = local_5b40._16_4_ * auVar79._16_4_;
                auVar71._20_4_ = local_5b40._20_4_ * auVar79._20_4_;
                auVar71._24_4_ = local_5b40._24_4_ * auVar79._24_4_;
                auVar71._28_4_ = 0;
                auVar79 = vsubps_avx(ZEXT1632(auVar91),auVar21);
                auVar59._0_4_ = auVar79._0_4_ * (float)local_5b20._0_4_;
                auVar59._4_4_ = auVar79._4_4_ * (float)local_5b20._4_4_;
                auVar59._8_4_ = auVar79._8_4_ * fStack_5b18;
                auVar59._12_4_ = auVar79._12_4_ * fStack_5b14;
                auVar59._16_4_ = auVar79._16_4_ * fStack_5b10;
                auVar59._20_4_ = auVar79._20_4_ * fStack_5b0c;
                auVar59._24_4_ = auVar79._24_4_ * fStack_5b08;
                auVar59._28_4_ = 0;
                auVar79 = vpminsd_avx2(auVar4,auVar82);
                auVar49 = vpminsd_avx2(auVar53,auVar71);
                auVar79 = vpmaxsd_avx2(auVar79,auVar49);
                auVar49 = vpminsd_avx2(auVar54,auVar59);
                auVar79 = vpmaxsd_avx2(auVar79,auVar49);
                auVar46._4_4_ = auVar79._4_4_ * 0.99999964;
                auVar46._0_4_ = auVar79._0_4_ * 0.99999964;
                auVar46._8_4_ = auVar79._8_4_ * 0.99999964;
                auVar46._12_4_ = auVar79._12_4_ * 0.99999964;
                auVar46._16_4_ = auVar79._16_4_ * 0.99999964;
                auVar46._20_4_ = auVar79._20_4_ * 0.99999964;
                auVar46._24_4_ = auVar79._24_4_ * 0.99999964;
                auVar46._28_4_ = auVar79._28_4_;
                auVar79 = vpmaxsd_avx2(auVar4,auVar82);
                auVar49 = vpmaxsd_avx2(auVar53,auVar71);
                auVar49 = vpminsd_avx2(auVar79,auVar49);
                auVar79 = vpmaxsd_avx2(auVar54,auVar59);
                auVar79 = vpminsd_avx2(auVar49,auVar79);
                auVar5._4_4_ = auVar79._4_4_ * 1.0000004;
                auVar5._0_4_ = auVar79._0_4_ * 1.0000004;
                auVar5._8_4_ = auVar79._8_4_ * 1.0000004;
                auVar5._12_4_ = auVar79._12_4_ * 1.0000004;
                auVar5._16_4_ = auVar79._16_4_ * 1.0000004;
                auVar5._20_4_ = auVar79._20_4_ * 1.0000004;
                auVar5._24_4_ = auVar79._24_4_ * 1.0000004;
                auVar5._28_4_ = auVar79._28_4_;
                auVar79 = vpmaxsd_avx2(auVar46,local_5aa0);
                auVar49 = vpminsd_avx2(auVar5,local_5a80);
                auVar79 = vcmpps_avx(auVar79,auVar49,2);
                if (uVar28 == 6) {
                  uVar27 = *(undefined4 *)(uVar26 + 0x1e0 + lVar33);
                  auVar61._4_4_ = uVar27;
                  auVar61._0_4_ = uVar27;
                  auVar61._8_4_ = uVar27;
                  auVar61._12_4_ = uVar27;
                  auVar61._16_4_ = uVar27;
                  auVar61._20_4_ = uVar27;
                  auVar61._24_4_ = uVar27;
                  auVar61._28_4_ = uVar27;
                  auVar49 = vcmpps_avx(auVar61,auVar38,2);
                  uVar27 = *(undefined4 *)(uVar26 + 0x200 + lVar33);
                  auVar66._4_4_ = uVar27;
                  auVar66._0_4_ = uVar27;
                  auVar66._8_4_ = uVar27;
                  auVar66._12_4_ = uVar27;
                  auVar66._16_4_ = uVar27;
                  auVar66._20_4_ = uVar27;
                  auVar66._24_4_ = uVar27;
                  auVar66._28_4_ = uVar27;
                  auVar38 = vcmpps_avx(auVar38,auVar66,1);
                  auVar38 = vandps_avx(auVar49,auVar38);
                  auVar38 = vandps_avx(auVar38,auVar79);
                  auVar35 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
                }
                else {
                  auVar35 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
                }
              }
              else {
                uVar27 = *(undefined4 *)(uVar26 + 0x60 + lVar33);
                auVar72._4_4_ = uVar27;
                auVar72._0_4_ = uVar27;
                auVar72._8_4_ = uVar27;
                auVar72._12_4_ = uVar27;
                auVar72._16_4_ = uVar27;
                auVar72._20_4_ = uVar27;
                auVar72._24_4_ = uVar27;
                auVar72._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x80 + lVar33);
                local_5a00._4_4_ = uVar27;
                local_5a00._0_4_ = uVar27;
                local_5a00._8_4_ = uVar27;
                local_5a00._12_4_ = uVar27;
                local_5a00._16_4_ = uVar27;
                local_5a00._20_4_ = uVar27;
                local_5a00._24_4_ = uVar27;
                local_5a00._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0xa0 + lVar33);
                local_59e0._4_4_ = uVar27;
                local_59e0._0_4_ = uVar27;
                local_59e0._8_4_ = uVar27;
                local_59e0._12_4_ = uVar27;
                local_59e0._16_4_ = uVar27;
                local_59e0._20_4_ = uVar27;
                local_59e0._24_4_ = uVar27;
                local_59e0._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0xc0 + lVar33);
                auVar98._4_4_ = uVar27;
                auVar98._0_4_ = uVar27;
                auVar98._8_4_ = uVar27;
                auVar98._12_4_ = uVar27;
                auVar98._16_4_ = uVar27;
                auVar98._20_4_ = uVar27;
                auVar98._24_4_ = uVar27;
                auVar98._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0xe0 + lVar33);
                auVar95._4_4_ = uVar27;
                auVar95._0_4_ = uVar27;
                auVar95._8_4_ = uVar27;
                auVar95._12_4_ = uVar27;
                auVar95._16_4_ = uVar27;
                auVar95._20_4_ = uVar27;
                auVar95._24_4_ = uVar27;
                auVar95._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x100 + lVar33);
                auVar93._4_4_ = uVar27;
                auVar93._0_4_ = uVar27;
                auVar93._8_4_ = uVar27;
                auVar93._12_4_ = uVar27;
                auVar93._16_4_ = uVar27;
                auVar93._20_4_ = uVar27;
                auVar93._24_4_ = uVar27;
                auVar93._28_4_ = uVar27;
                fVar67 = *(float *)(uVar26 + 0x120 + lVar33);
                auVar100._4_4_ = fVar67;
                auVar100._0_4_ = fVar67;
                auVar100._8_4_ = fVar67;
                auVar100._12_4_ = fVar67;
                auVar100._16_4_ = fVar67;
                auVar100._20_4_ = fVar67;
                auVar100._24_4_ = fVar67;
                auVar100._28_4_ = fVar67;
                fVar73 = *(float *)(uVar26 + 0x140 + lVar33);
                auVar113._4_4_ = fVar73;
                auVar113._0_4_ = fVar73;
                auVar113._8_4_ = fVar73;
                auVar113._12_4_ = fVar73;
                auVar113._16_4_ = fVar73;
                auVar113._20_4_ = fVar73;
                auVar113._24_4_ = fVar73;
                auVar113._28_4_ = fVar73;
                fVar74 = *(float *)(uVar26 + 0x160 + lVar33);
                auVar36._4_4_ = fVar74;
                auVar36._0_4_ = fVar74;
                auVar36._8_4_ = fVar74;
                auVar36._12_4_ = fVar74;
                auVar36._16_4_ = fVar74;
                auVar36._20_4_ = fVar74;
                auVar36._24_4_ = fVar74;
                auVar36._28_4_ = fVar74;
                uVar27 = *(undefined4 *)(uVar26 + 0x180 + lVar33);
                auVar60._4_4_ = uVar27;
                auVar60._0_4_ = uVar27;
                auVar60._8_4_ = uVar27;
                auVar60._12_4_ = uVar27;
                auVar60._16_4_ = uVar27;
                auVar60._20_4_ = uVar27;
                auVar60._24_4_ = uVar27;
                auVar60._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x1a0 + lVar33);
                auVar51._4_4_ = uVar27;
                auVar51._0_4_ = uVar27;
                auVar51._8_4_ = uVar27;
                auVar51._12_4_ = uVar27;
                auVar51._16_4_ = uVar27;
                auVar51._20_4_ = uVar27;
                auVar51._24_4_ = uVar27;
                auVar51._28_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar26 + 0x1c0 + lVar33);
                auVar83._4_4_ = uVar27;
                auVar83._0_4_ = uVar27;
                auVar83._8_4_ = uVar27;
                auVar83._12_4_ = uVar27;
                auVar83._16_4_ = uVar27;
                auVar83._20_4_ = uVar27;
                auVar83._24_4_ = uVar27;
                auVar83._28_4_ = uVar27;
                fVar75 = *(float *)(uVar26 + 0x1e0 + lVar33);
                fVar76 = *(float *)(uVar26 + 0x200 + lVar33);
                fVar77 = *(float *)(uVar26 + 0x220 + lVar33);
                auVar22._8_8_ = local_5c20._72_8_;
                auVar22._0_8_ = local_5c20._64_8_;
                auVar22._16_8_ = local_5c20._80_8_;
                auVar22._24_8_ = local_5c20._88_8_;
                auVar35 = vfmadd231ps_fma(auVar60,auVar22,auVar100);
                auVar68 = vfmadd231ps_fma(auVar51,auVar22,auVar113);
                auVar62 = vfmadd231ps_fma(auVar83,auVar22,auVar36);
                auVar6._4_4_ = fVar67 * (float)local_5b80._4_4_;
                auVar6._0_4_ = fVar67 * (float)local_5b80._0_4_;
                auVar6._8_4_ = fVar67 * fStack_5b78;
                auVar6._12_4_ = fVar67 * fStack_5b74;
                auVar6._16_4_ = fVar67 * fStack_5b70;
                auVar6._20_4_ = fVar67 * fStack_5b6c;
                auVar6._24_4_ = fVar67 * fStack_5b68;
                auVar6._28_4_ = fVar67;
                auVar7._4_4_ = fVar73 * (float)local_5b80._4_4_;
                auVar7._0_4_ = fVar73 * (float)local_5b80._0_4_;
                auVar7._8_4_ = fVar73 * fStack_5b78;
                auVar7._12_4_ = fVar73 * fStack_5b74;
                auVar7._16_4_ = fVar73 * fStack_5b70;
                auVar7._20_4_ = fVar73 * fStack_5b6c;
                auVar7._24_4_ = fVar73 * fStack_5b68;
                auVar7._28_4_ = fVar73;
                auVar8._4_4_ = (float)local_5b80._4_4_ * fVar74;
                auVar8._0_4_ = (float)local_5b80._0_4_ * fVar74;
                auVar8._8_4_ = fStack_5b78 * fVar74;
                auVar8._12_4_ = fStack_5b74 * fVar74;
                auVar8._16_4_ = fStack_5b70 * fVar74;
                auVar8._20_4_ = fStack_5b6c * fVar74;
                auVar8._24_4_ = fStack_5b68 * fVar74;
                auVar8._28_4_ = fVar74;
                auVar86 = vfmadd231ps_fma(auVar6,local_5ba0,auVar98);
                auVar94 = vfmadd231ps_fma(auVar7,local_5ba0,auVar95);
                auVar91 = vfmadd231ps_fma(auVar8,auVar93,local_5ba0);
                fVar67 = *(float *)(uVar26 + 0x240 + lVar33);
                auVar20._8_8_ = local_5c20._40_8_;
                auVar20._0_8_ = local_5c20._32_8_;
                auVar20._16_8_ = local_5c20._48_8_;
                auVar20._24_8_ = local_5c20._56_8_;
                auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar20,auVar98);
                auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar20,auVar95);
                fVar73 = *(float *)(uVar26 + 0x260 + lVar33);
                auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar20,auVar93);
                fVar74 = *(float *)(uVar26 + 0x280 + lVar33);
                auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_5bc0,auVar72);
                auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_5bc0,local_5a00);
                auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_59e0,local_5bc0);
                auVar38 = vandps_avx(ZEXT1632(auVar86),local_5a20);
                auVar39._8_4_ = 0x219392ef;
                auVar39._0_8_ = 0x219392ef219392ef;
                auVar39._12_4_ = 0x219392ef;
                auVar39._16_4_ = 0x219392ef;
                auVar39._20_4_ = 0x219392ef;
                auVar39._24_4_ = 0x219392ef;
                auVar39._28_4_ = 0x219392ef;
                auVar38 = vcmpps_avx(auVar38,auVar39,1);
                auVar79 = vblendvps_avx(ZEXT1632(auVar86),auVar39,auVar38);
                auVar38 = vandps_avx(ZEXT1632(auVar94),local_5a20);
                auVar38 = vcmpps_avx(auVar38,auVar39,1);
                auVar49 = vblendvps_avx(ZEXT1632(auVar94),auVar39,auVar38);
                auVar38 = vandps_avx(local_5a20,ZEXT1632(auVar91));
                auVar54 = vcmpps_avx(auVar38,auVar39,1);
                auVar53 = vblendvps_avx(ZEXT1632(auVar91),auVar39,auVar54);
                auVar38 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar78 = auVar38._0_4_;
                auVar114._0_4_ = fVar78 * fVar75;
                fVar102 = auVar38._4_4_;
                auVar114._4_4_ = fVar102 * fVar75;
                fVar103 = auVar38._8_4_;
                auVar114._8_4_ = fVar103 * fVar75;
                fVar104 = auVar38._12_4_;
                auVar114._12_4_ = fVar104 * fVar75;
                fVar106 = auVar38._16_4_;
                auVar114._16_4_ = fVar106 * fVar75;
                fVar108 = auVar38._20_4_;
                auVar114._20_4_ = fVar108 * fVar75;
                fVar110 = auVar38._24_4_;
                auVar114._24_4_ = fVar110 * fVar75;
                auVar114._28_4_ = 0;
                auVar9._4_4_ = fVar102 * fVar76;
                auVar9._0_4_ = fVar78 * fVar76;
                auVar9._8_4_ = fVar103 * fVar76;
                auVar9._12_4_ = fVar104 * fVar76;
                auVar9._16_4_ = fVar106 * fVar76;
                auVar9._20_4_ = fVar108 * fVar76;
                auVar9._24_4_ = fVar110 * fVar76;
                auVar9._28_4_ = auVar54._28_4_;
                auVar10._4_4_ = fVar77 * fVar102;
                auVar10._0_4_ = fVar77 * fVar78;
                auVar10._8_4_ = fVar77 * fVar103;
                auVar10._12_4_ = fVar77 * fVar104;
                auVar10._16_4_ = fVar77 * fVar106;
                auVar10._20_4_ = fVar77 * fVar108;
                auVar10._24_4_ = fVar77 * fVar110;
                auVar10._28_4_ = fVar77;
                auVar45._8_4_ = 0x3f800000;
                auVar45._0_8_ = 0x3f8000003f800000;
                auVar45._12_4_ = 0x3f800000;
                auVar45._16_4_ = 0x3f800000;
                auVar45._20_4_ = 0x3f800000;
                auVar45._24_4_ = 0x3f800000;
                auVar45._28_4_ = 0x3f800000;
                auVar38 = vsubps_avx(auVar45,auVar38);
                auVar54 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar86 = vfmadd231ps_fma(auVar114,auVar38,auVar54);
                auVar115 = ZEXT1664(auVar86);
                auVar94 = vfmadd231ps_fma(auVar9,auVar38,auVar54);
                auVar91 = vfmadd231ps_fma(auVar10,auVar38,ZEXT1232(ZEXT412(0)) << 0x20);
                fVar75 = auVar38._0_4_;
                auVar88._0_4_ = fVar75 + fVar67 * fVar78;
                fVar76 = auVar38._4_4_;
                auVar88._4_4_ = fVar76 + fVar67 * fVar102;
                fVar77 = auVar38._8_4_;
                auVar88._8_4_ = fVar77 + fVar67 * fVar103;
                fVar105 = auVar38._12_4_;
                auVar88._12_4_ = fVar105 + fVar67 * fVar104;
                fVar107 = auVar38._16_4_;
                auVar88._16_4_ = fVar107 + fVar67 * fVar106;
                fVar109 = auVar38._20_4_;
                auVar88._20_4_ = fVar109 + fVar67 * fVar108;
                fVar111 = auVar38._24_4_;
                auVar88._24_4_ = fVar111 + fVar67 * fVar110;
                fVar112 = auVar38._28_4_;
                auVar88._28_4_ = fVar112 + fVar67;
                auVar99._0_4_ = fVar75 + fVar78 * fVar73;
                auVar99._4_4_ = fVar76 + fVar102 * fVar73;
                auVar99._8_4_ = fVar77 + fVar103 * fVar73;
                auVar99._12_4_ = fVar105 + fVar104 * fVar73;
                auVar99._16_4_ = fVar107 + fVar106 * fVar73;
                auVar99._20_4_ = fVar109 + fVar108 * fVar73;
                auVar99._24_4_ = fVar111 + fVar110 * fVar73;
                auVar99._28_4_ = fVar112 + fVar73;
                auVar40._0_4_ = fVar75 + fVar78 * fVar74;
                auVar40._4_4_ = fVar76 + fVar102 * fVar74;
                auVar40._8_4_ = fVar77 + fVar103 * fVar74;
                auVar40._12_4_ = fVar105 + fVar104 * fVar74;
                auVar40._16_4_ = fVar107 + fVar106 * fVar74;
                auVar40._20_4_ = fVar109 + fVar108 * fVar74;
                auVar40._24_4_ = fVar111 + fVar110 * fVar74;
                auVar40._28_4_ = fVar112 + 1e-18;
                auVar18._8_8_ = local_5c20._8_8_;
                auVar18._0_8_ = local_5c20._0_8_;
                auVar18._16_8_ = local_5c20._16_8_;
                auVar18._24_8_ = local_5c20._24_8_;
                auVar101 = ZEXT3264(auVar18);
                auVar92 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar18,auVar72);
                auVar90 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar18,local_5a00);
                auVar96 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar18,local_59e0);
                auVar38 = vrcpps_avx(auVar79);
                auVar35 = vfnmadd213ps_fma(auVar79,auVar38,auVar45);
                auVar79 = vrcpps_avx(auVar49);
                auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar38,auVar38);
                auVar38 = vrcpps_avx(auVar53);
                auVar68 = vfnmadd213ps_fma(auVar49,auVar79,auVar45);
                auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar79,auVar79);
                auVar62 = vfnmadd213ps_fma(auVar53,auVar38,auVar45);
                auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar38,auVar38);
                auVar38 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar92));
                auVar79 = vsubps_avx(auVar88,ZEXT1632(auVar92));
                auVar89 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar11._4_4_ = auVar35._4_4_ * auVar38._4_4_;
                auVar11._0_4_ = auVar35._0_4_ * auVar38._0_4_;
                auVar11._8_4_ = auVar35._8_4_ * auVar38._8_4_;
                auVar11._12_4_ = auVar35._12_4_ * auVar38._12_4_;
                auVar11._16_4_ = auVar38._16_4_ * 0.0;
                auVar11._20_4_ = auVar38._20_4_ * 0.0;
                auVar11._24_4_ = auVar38._24_4_ * 0.0;
                auVar11._28_4_ = auVar38._28_4_;
                auVar12._4_4_ = auVar35._4_4_ * auVar79._4_4_;
                auVar12._0_4_ = auVar35._0_4_ * auVar79._0_4_;
                auVar12._8_4_ = auVar35._8_4_ * auVar79._8_4_;
                auVar12._12_4_ = auVar35._12_4_ * auVar79._12_4_;
                auVar12._16_4_ = auVar79._16_4_ * 0.0;
                auVar12._20_4_ = auVar79._20_4_ * 0.0;
                auVar12._24_4_ = auVar79._24_4_ * 0.0;
                auVar12._28_4_ = auVar79._28_4_;
                auVar38 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar90));
                auVar79 = vsubps_avx(auVar99,ZEXT1632(auVar90));
                auVar13._4_4_ = auVar68._4_4_ * auVar38._4_4_;
                auVar13._0_4_ = auVar68._0_4_ * auVar38._0_4_;
                auVar13._8_4_ = auVar68._8_4_ * auVar38._8_4_;
                auVar13._12_4_ = auVar68._12_4_ * auVar38._12_4_;
                auVar13._16_4_ = auVar38._16_4_ * 0.0;
                auVar13._20_4_ = auVar38._20_4_ * 0.0;
                auVar13._24_4_ = auVar38._24_4_ * 0.0;
                auVar13._28_4_ = auVar38._28_4_;
                auVar14._4_4_ = auVar68._4_4_ * auVar79._4_4_;
                auVar14._0_4_ = auVar68._0_4_ * auVar79._0_4_;
                auVar14._8_4_ = auVar68._8_4_ * auVar79._8_4_;
                auVar14._12_4_ = auVar68._12_4_ * auVar79._12_4_;
                auVar14._16_4_ = auVar79._16_4_ * 0.0;
                auVar14._20_4_ = auVar79._20_4_ * 0.0;
                auVar14._24_4_ = auVar79._24_4_ * 0.0;
                auVar14._28_4_ = auVar79._28_4_;
                auVar38 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar96));
                auVar15._4_4_ = auVar62._4_4_ * auVar38._4_4_;
                auVar15._0_4_ = auVar62._0_4_ * auVar38._0_4_;
                auVar15._8_4_ = auVar62._8_4_ * auVar38._8_4_;
                auVar15._12_4_ = auVar62._12_4_ * auVar38._12_4_;
                auVar15._16_4_ = auVar38._16_4_ * 0.0;
                auVar15._20_4_ = auVar38._20_4_ * 0.0;
                auVar15._24_4_ = auVar38._24_4_ * 0.0;
                auVar15._28_4_ = auVar38._28_4_;
                auVar38 = vsubps_avx(auVar40,ZEXT1632(auVar96));
                auVar37._0_4_ = auVar62._0_4_ * auVar38._0_4_;
                auVar37._4_4_ = auVar62._4_4_ * auVar38._4_4_;
                auVar37._8_4_ = auVar62._8_4_ * auVar38._8_4_;
                auVar37._12_4_ = auVar62._12_4_ * auVar38._12_4_;
                auVar37._16_4_ = auVar38._16_4_ * 0.0;
                auVar37._20_4_ = auVar38._20_4_ * 0.0;
                auVar37._24_4_ = auVar38._24_4_ * 0.0;
                auVar37._28_4_ = 0;
                auVar38 = vpminsd_avx2(auVar11,auVar12);
                auVar79 = vpminsd_avx2(auVar13,auVar14);
                auVar38 = vpmaxsd_avx2(auVar38,auVar79);
                auVar79 = vpminsd_avx2(auVar15,auVar37);
                auVar38 = vpmaxsd_avx2(auVar38,auVar79);
                auVar79 = vpmaxsd_avx2(auVar11,auVar12);
                auVar49 = vpmaxsd_avx2(auVar13,auVar14);
                auVar49 = vpminsd_avx2(auVar79,auVar49);
                auVar79 = vpmaxsd_avx2(auVar15,auVar37);
                auVar79 = vpminsd_avx2(auVar49,auVar79);
                auVar46._4_4_ = auVar38._4_4_ * 0.99999964;
                auVar46._0_4_ = auVar38._0_4_ * 0.99999964;
                auVar46._8_4_ = auVar38._8_4_ * 0.99999964;
                auVar46._12_4_ = auVar38._12_4_ * 0.99999964;
                auVar46._16_4_ = auVar38._16_4_ * 0.99999964;
                auVar46._20_4_ = auVar38._20_4_ * 0.99999964;
                auVar46._24_4_ = auVar38._24_4_ * 0.99999964;
                auVar46._28_4_ = 0x3f7ffffa;
                auVar16._4_4_ = auVar79._4_4_ * 1.0000004;
                auVar16._0_4_ = auVar79._0_4_ * 1.0000004;
                auVar16._8_4_ = auVar79._8_4_ * 1.0000004;
                auVar16._12_4_ = auVar79._12_4_ * 1.0000004;
                auVar16._16_4_ = auVar79._16_4_ * 1.0000004;
                auVar16._20_4_ = auVar79._20_4_ * 1.0000004;
                auVar16._24_4_ = auVar79._24_4_ * 1.0000004;
                auVar16._28_4_ = auVar79._28_4_;
                auVar38 = vpmaxsd_avx2(auVar46,local_5aa0);
                auVar79 = vpminsd_avx2(auVar16,local_5a80);
                auVar38 = vcmpps_avx(auVar38,auVar79,2);
                auVar35 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
              }
              auVar68 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
              auVar35 = vpand_avx(auVar35,auVar68);
              auVar38 = vpmovzxwd_avx2(auVar35);
              auVar38 = vpslld_avx2(auVar38,0x1f);
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) {
                auVar52 = ZEXT3264(auVar42);
                uVar2 = uVar31;
              }
              else {
                auVar38 = vblendvps_avx(auVar89._0_32_,auVar46,auVar38);
                auVar52 = ZEXT3264(auVar38);
                if (uVar31 != 8) {
                  *puVar32 = uVar31;
                  puVar32 = puVar32 + 1;
                  local_5ce0 = auVar42._0_8_;
                  uStack_5cd8 = auVar42._8_8_;
                  uStack_5cd0 = auVar42._16_8_;
                  uStack_5cc8 = auVar42._24_8_;
                  *(undefined8 *)*pauVar34 = local_5ce0;
                  *(undefined8 *)(*pauVar34 + 8) = uStack_5cd8;
                  *(undefined8 *)(*pauVar34 + 0x10) = uStack_5cd0;
                  *(undefined8 *)(*pauVar34 + 0x18) = uStack_5cc8;
                  pauVar34 = pauVar34 + 1;
                }
              }
              uVar31 = uVar2;
              auVar42 = auVar52._0_32_;
              lVar33 = lVar33 + 4;
            } while (lVar33 != 0);
            if (uVar31 == 8) goto LAB_00611444;
            auVar48 = vcmpps_avx(local_5a80,auVar52._0_32_,6);
            uVar27 = vmovmskps_avx(auVar48);
            root.ptr = uVar31;
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar27));
          *puVar32 = uVar31;
          puVar32 = puVar32 + 1;
          *pauVar34 = auVar52._0_32_;
          pauVar34 = pauVar34 + 1;
        }
        else {
          for (; pRVar29 != (RTCIntersectArguments *)0x0;
              pRVar29 = (RTCIntersectArguments *)
                        ((ulong)((long)&pRVar29[-1].intersect + 7U) & (ulong)pRVar29)) {
            sVar1 = 0;
            for (pRVar3 = pRVar29; ((ulong)pRVar3 & 1) == 0;
                pRVar3 = (RTCIntersectArguments *)((ulong)pRVar3 >> 1 | 0x8000000000000000)) {
              sVar1 = sVar1 + 1;
            }
            auVar101 = ZEXT1664(auVar101._0_16_);
            auVar115 = ZEXT1664(auVar115._0_16_);
            bVar24 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5c20.field_0,context);
            if (bVar24) {
              *(undefined4 *)(local_5c60 + sVar1 * 4) = 0xffffffff;
            }
            auVar89 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
          }
          auVar52 = ZEXT3264(auVar48);
          auVar48 = _DAT_01fe9960 & ~local_5c60;
          iVar25 = 3;
          if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar48 >> 0x7f,0) != '\0') ||
                (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar48 >> 0xbf,0) != '\0') ||
              (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar48[0x1f] < '\0') {
            auVar48._8_4_ = 0xff800000;
            auVar48._0_8_ = 0xff800000ff800000;
            auVar48._12_4_ = 0xff800000;
            auVar48._16_4_ = 0xff800000;
            auVar48._20_4_ = 0xff800000;
            auVar48._24_4_ = 0xff800000;
            auVar48._28_4_ = 0xff800000;
            local_5a80 = vblendvps_avx(local_5a80,auVar48,local_5c60);
            iVar25 = 2;
          }
          pRVar29 = (RTCIntersectArguments *)0x0;
          if (uVar30 < (uint)POPCOUNT(uVar27)) goto LAB_00610eb0;
        }
LAB_00611444:
        pRVar29 = (RTCIntersectArguments *)0x0;
      } while (iVar25 != 3);
LAB_0061165c:
      auVar48 = vandps_avx(local_5a60,local_5c60);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      auVar41._16_4_ = 0xff800000;
      auVar41._20_4_ = 0xff800000;
      auVar41._24_4_ = 0xff800000;
      auVar41._28_4_ = 0xff800000;
      auVar48 = vmaskmovps_avx(auVar48,auVar41);
      *(undefined1 (*) [32])(ray + 0x100) = auVar48;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }